

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes_modes.c
# Opt level: O2

int aes_test_alignment_detection(uint n)

{
  int iVar1;
  uint uVar2;
  undefined1 *puVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  undefined1 *puVar8;
  ulong uVar9;
  undefined1 local_28 [16];
  uint8_t p [16];
  
  uVar2 = 1;
  if (0xfffffff2 < n - 0x11) {
    puVar3 = local_28;
    uVar2 = n - 1;
    iVar1 = (int)puVar3;
    iVar5 = 0;
    uVar6 = 0;
    puVar8 = puVar3;
    for (lVar7 = 0; (ulong)n + lVar7 != 0; lVar7 = lVar7 + -1) {
      uVar4 = -(ulong)((uint)puVar3 & uVar2);
      uVar9 = (ulong)((int)lVar7 - iVar1 & uVar2);
      if (uVar9 == uVar4) {
        iVar5 = iVar5 + 1;
      }
      else {
        if (puVar8 + n + uVar4 != puVar8 + uVar9) {
          return 1;
        }
        uVar6 = uVar6 + 1;
      }
      puVar8 = puVar8 + 1;
      puVar3 = puVar3 + 1;
    }
    uVar2 = (uint)(uVar6 != uVar2 || iVar5 != 1);
  }
  return uVar2;
}

Assistant:

AES_RETURN aes_test_alignment_detection(unsigned int n)	/* 4 <= n <= 16 */
{	uint8_t	p[16];
    uint32_t i, count_eq = 0, count_neq = 0;

    if(n < 4 || n > 16)
        return EXIT_FAILURE;

    for(i = 0; i < n; ++i)
    {
        uint8_t *qf = ALIGN_FLOOR(p + i, n),
                *qh =  ALIGN_CEIL(p + i, n);
        
        if(qh == qf)
            ++count_eq;
        else if(qh == qf + n)
            ++count_neq;
        else
            return EXIT_FAILURE;
    }
    return (count_eq != 1 || count_neq != n - 1 ? EXIT_FAILURE : EXIT_SUCCESS);
}